

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O2

void __thiscall despot::POMDPX::InitStates(POMDPX *this)

{
  pointer ppPVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  log_ostream *plVar4;
  ostream *poVar5;
  int s;
  ulong uVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  if (this->is_small_ == false) {
    __assert_fail("is_small_",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/pomdpx.cpp"
                  ,0x126,"void despot::POMDPX::InitStates()");
  }
  dVar8 = get_time_second();
  iVar2 = (*(this->super_MDP)._vptr_MDP[2])(this);
  std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::resize
            (&this->states_,(long)iVar2);
  for (uVar6 = 0;
      uVar6 < (ulong)((long)(this->states_).
                            super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->states_).
                            super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1) {
    iVar2 = (*(this->super_MDP)._vptr_MDP[0x19])(0,this,uVar6 & 0xffffffff);
    Parser::ComputeState((vector<int,_std::allocator<int>_> *)&local_38,this->parser_,(int)uVar6);
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              (&((POMDPXState *)CONCAT44(extraout_var,iVar2))->vec_id,&local_38);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
    (this->states_).
    super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6] = (POMDPXState *)CONCAT44(extraout_var,iVar2);
  }
  uVar6 = 0;
  do {
    ppPVar1 = (this->states_).
              super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->states_).
                      super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3) <= uVar6) {
      iVar2 = logging::level();
      if (0 < iVar2) {
        iVar2 = logging::level();
        if (2 < iVar2) {
          plVar4 = logging::stream(3);
          std::operator<<(&plVar4->super_ostream,"[POMDPX::InitState] Initialized state table in ");
          dVar9 = get_time_second();
          poVar5 = std::ostream::_M_insert<double>(dVar9 - dVar8);
          poVar5 = std::operator<<(poVar5,"s");
          std::endl<char,std::char_traits<char>>(poVar5);
        }
      }
      return;
    }
    uVar3 = (*(this->super_MDP)._vptr_MDP[9])(this,ppPVar1[uVar6]);
    bVar7 = uVar6 == uVar3;
    uVar6 = uVar6 + 1;
  } while (bVar7);
  __assert_fail("GetIndex(states_[s]) == s",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/pomdpx.cpp"
                ,0x132,"void despot::POMDPX::InitStates()");
}

Assistant:

void POMDPX::InitStates() {
	assert(is_small_);

	double start = get_time_second();
	states_.resize(NumStates());

	for (int s = 0; s < states_.size(); s++) {
		POMDPXState* state = static_cast<POMDPXState*>(Allocate(s, 0));
		state->vec_id = parser_->ComputeState(s);
		states_[s] = state;
	}

	for (int s = 0; s < states_.size(); s++)
		assert(GetIndex(states_[s]) == s);

	logi << "[POMDPX::InitState] Initialized state table in "
		<< (get_time_second() - start) << "s" << endl;
}